

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mxnet2ncnn.cpp
# Opt level: O3

bool __thiscall MXNetNode::has_weight(MXNetNode *this,int i)

{
  int iVar1;
  pointer piVar2;
  pointer pMVar3;
  pointer pMVar4;
  size_t __n;
  int iVar5;
  size_type *psVar6;
  uint uVar7;
  ulong uVar8;
  
  if ((-1 < i) &&
     (piVar2 = (this->weights).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start,
     i < (int)((ulong)((long)(this->weights).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_finish - (long)piVar2) >> 2))) {
    pMVar3 = (this->params->super__Vector_base<MXNetParam,_std::allocator<MXNetParam>_>)._M_impl.
             super__Vector_impl_data._M_start;
    uVar7 = (int)((long)(this->params->super__Vector_base<MXNetParam,_std::allocator<MXNetParam>_>).
                        _M_impl.super__Vector_impl_data._M_finish - (long)pMVar3 >> 3) * -0x45d1745d
    ;
    if (0 < (int)uVar7) {
      iVar1 = piVar2[(uint)i];
      pMVar4 = (this->nodes->super__Vector_base<MXNetNode,_std::allocator<MXNetNode>_>)._M_impl.
               super__Vector_impl_data._M_start;
      __n = pMVar4[iVar1].name._M_string_length;
      uVar8 = (ulong)(uVar7 & 0x7fffffff);
      psVar6 = &(pMVar3->name)._M_string_length;
      do {
        if (*psVar6 == __n) {
          if (__n == 0) {
            return true;
          }
          iVar5 = bcmp((((string *)(psVar6 + -1))->_M_dataplus)._M_p,
                       pMVar4[iVar1].name._M_dataplus._M_p,__n);
          if (iVar5 == 0) {
            return true;
          }
        }
        psVar6 = psVar6 + 0xb;
        uVar8 = uVar8 - 1;
      } while (uVar8 != 0);
    }
  }
  return false;
}

Assistant:

bool MXNetNode::has_weight(int i) const
{
    if (i < 0 || i >= (int)weights.size())
        return false;

    const std::string& name = (*nodes)[ weights[i] ].name;

    for (int i=0; i<(int)(*params).size(); i++)
    {
        const MXNetParam& p = (*params)[i];
        if (p.name == name)
            return true;
    }

    return false;
}